

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O2

BOOL read_repeat_counts(PCRE2_SPTR8 *ptrptr,PCRE2_SPTR8 ptrend,uint32_t *minp,uint32_t *maxp,
                       int *errorcodeptr)

{
  bool bVar1;
  BOOL BVar2;
  BOOL BVar3;
  PCRE2_SPTR8 pPVar4;
  PCRE2_SPTR8 pPVar5;
  PCRE2_UCHAR8 PVar6;
  PCRE2_SPTR8 local_40;
  int32_t max;
  int32_t min;
  
  local_40 = *ptrptr;
  min = 0;
  max = 0x10000;
  *errorcodeptr = 0;
  for (; pPVar5 = local_40, local_40 < ptrend; local_40 = local_40 + 1) {
    PVar6 = *local_40;
    if ((PVar6 != ' ') && (PVar6 != '\t')) {
      bVar1 = true;
      if ((byte)(PVar6 - 0x30) < 10) goto LAB_0017b414;
      goto LAB_0017b393;
    }
  }
  bVar1 = true;
  goto LAB_0017b393;
  while ((byte)(*pPVar5 - 0x30) < 10) {
LAB_0017b414:
    pPVar5 = pPVar5 + 1;
    if (ptrend <= pPVar5) {
      bVar1 = false;
      pPVar5 = ptrend;
      goto LAB_0017b393;
    }
  }
  bVar1 = false;
LAB_0017b393:
  while( true ) {
    if (ptrend <= pPVar5) {
      return 0;
    }
    PVar6 = *pPVar5;
    if ((PVar6 != '\t') && (PVar6 != ' ')) break;
    pPVar5 = pPVar5 + 1;
  }
  if (PVar6 == '}') {
    if (bVar1) {
      return 0;
    }
  }
  else {
    if (PVar6 != ',') {
      return 0;
    }
    do {
      pPVar4 = pPVar5;
      pPVar5 = pPVar4 + 1;
      if (ptrend <= pPVar5) {
        return 0;
      }
      PVar6 = *pPVar5;
    } while ((PVar6 == ' ') || (PVar6 == '\t'));
    if ((byte)(PVar6 - 0x30) < 10) {
      pPVar4 = pPVar4 + 2;
      do {
        pPVar5 = ptrend;
        if (ptrend <= pPVar4) break;
        PVar6 = *pPVar4;
        pPVar5 = pPVar4;
        pPVar4 = pPVar4 + 1;
      } while ((byte)(PVar6 - 0x30) < 10);
    }
    else if (bVar1) {
      return 0;
    }
    while( true ) {
      if (ptrend <= pPVar5) {
        return 0;
      }
      PVar6 = *pPVar5;
      if ((PVar6 != '\t') && (PVar6 != ' ')) break;
      pPVar5 = pPVar5 + 1;
    }
    if (PVar6 != '}') {
      return 0;
    }
  }
  BVar2 = read_number(&local_40,ptrend,-1,0xffff,0x69,&min,errorcodeptr);
  if (BVar2 == 0) {
    BVar2 = 0;
    if (*errorcodeptr != 0) goto LAB_0017b5ac;
    do {
      local_40 = local_40 + 1;
      if (ptrend <= local_40) break;
    } while ((*local_40 == ' ') || (*local_40 == '\t'));
    BVar3 = read_number(&local_40,ptrend,-1,0xffff,0x69,&max,errorcodeptr);
    if ((BVar3 == 0) && (*errorcodeptr != 0)) goto LAB_0017b5ac;
  }
  else {
    for (; local_40 < ptrend; local_40 = local_40 + 1) {
      PVar6 = *local_40;
      if ((PVar6 != ' ') && (PVar6 != '\t')) goto LAB_0017b504;
    }
    PVar6 = *local_40;
LAB_0017b504:
    if (PVar6 == '}') {
      max = min;
    }
    else {
      do {
        local_40 = local_40 + 1;
        if (ptrend <= local_40) break;
      } while ((*local_40 == ' ') || (*local_40 == '\t'));
      BVar2 = read_number(&local_40,ptrend,-1,0xffff,0x69,&max,errorcodeptr);
      if ((BVar2 == 0) && (BVar2 = 0, *errorcodeptr != 0)) goto LAB_0017b5ac;
      if (max < min) {
        *errorcodeptr = 0x68;
        BVar2 = 0;
        goto LAB_0017b5ac;
      }
    }
  }
  for (; (local_40 < ptrend && ((*local_40 == ' ' || (*local_40 == '\t')))); local_40 = local_40 + 1
      ) {
  }
  local_40 = local_40 + 1;
  if (minp != (uint32_t *)0x0) {
    *minp = min;
  }
  BVar2 = 1;
  if (maxp != (uint32_t *)0x0) {
    *maxp = max;
  }
LAB_0017b5ac:
  *ptrptr = local_40;
  return BVar2;
}

Assistant:

static BOOL
read_repeat_counts(PCRE2_SPTR *ptrptr, PCRE2_SPTR ptrend, uint32_t *minp,
  uint32_t *maxp, int *errorcodeptr)
{
PCRE2_SPTR p = *ptrptr;
PCRE2_SPTR pp;
BOOL yield = FALSE;
BOOL had_minimum = FALSE;
int32_t min = 0;
int32_t max = REPEAT_UNLIMITED; /* This value is larger than MAX_REPEAT_COUNT */

*errorcodeptr = 0;
while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;

/* Check the syntax before interpreting. Otherwise, a non-quantifier sequence
such as "X{123456ABC" would incorrectly give a "number too big in quantifier"
error. */

pp = p;
if (pp < ptrend && IS_DIGIT(*pp))
  {
  had_minimum = TRUE;
  while (++pp < ptrend && IS_DIGIT(*pp)) {}
  }

while (pp < ptrend && (*pp == CHAR_SPACE || *pp == CHAR_HT)) pp++;
if (pp >= ptrend) return FALSE;

if (*pp == CHAR_RIGHT_CURLY_BRACKET)
  {
  if (!had_minimum) return FALSE;
  }
else
  {
  if (*pp++ != CHAR_COMMA) return FALSE;
  while (pp < ptrend && (*pp == CHAR_SPACE || *pp == CHAR_HT)) pp++;
  if (pp >= ptrend) return FALSE;
  if (IS_DIGIT(*pp))
    {
    while (++pp < ptrend && IS_DIGIT(*pp)) {}
    }
  else if (!had_minimum) return FALSE;
  while (pp < ptrend && (*pp == CHAR_SPACE || *pp == CHAR_HT)) pp++;
  if (pp >= ptrend || *pp != CHAR_RIGHT_CURLY_BRACKET) return FALSE;
  }

/* Now process the quantifier for real. We know it must be {n} or (n,} or {,m}
or {n,m}. The only error that read_number() can return is for a number that is
too big. If *errorcodeptr is returned as zero it means no number was found. */

/* Deal with {,m} or n too big. If we successfully read m there is no need to
check m >= n because n defaults to zero. */

if (!read_number(&p, ptrend, -1, MAX_REPEAT_COUNT, ERR5, &min, errorcodeptr))
  {
  if (*errorcodeptr != 0) goto EXIT;    /* n too big */
  p++;  /* Skip comma and subsequent spaces */
  while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
  if (!read_number(&p, ptrend, -1, MAX_REPEAT_COUNT, ERR5, &max, errorcodeptr))
    {
    if (*errorcodeptr != 0) goto EXIT;  /* m too big */
    }
  }

/* Have read one number. Deal with {n} or {n,} or {n,m} */

else
  {
  while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
  if (*p == CHAR_RIGHT_CURLY_BRACKET)
    {
    max = min;
    }
  else   /* Handle {n,} or {n,m} */
    {
    p++;    /* Skip comma and subsequent spaces */
    while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
    if (!read_number(&p, ptrend, -1, MAX_REPEAT_COUNT, ERR5, &max, errorcodeptr))
      {
      if (*errorcodeptr != 0) goto EXIT;   /* m too big */
      }

    if (max < min)
      {
      *errorcodeptr = ERR4;
      goto EXIT;
      }
    }
  }

/* Valid quantifier exists */

while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
p++;
yield = TRUE;
if (minp != NULL) *minp = (uint32_t)min;
if (maxp != NULL) *maxp = (uint32_t)max;

/* Update the pattern pointer */

EXIT:
*ptrptr = p;
return yield;
}